

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  Atom *pAVar2;
  _func_int **pp_Var3;
  Term *pTVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  Term *pTVar10;
  Compound *pCVar11;
  Term **ppTVar12;
  Clause *pCVar13;
  Term *pTVar14;
  Term *pTVar15;
  Term *pTVar16;
  Compound *pCVar17;
  Term *pTVar18;
  Clause *pCVar19;
  Goal *pGVar20;
  Variable *pVVar21;
  _func_int *p_Var22;
  undefined8 *puVar23;
  Program *prog;
  Program *pPVar24;
  Program *pPVar25;
  VarMapping *vars_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  long lVar27;
  long *plVar28;
  Variable *vars [2];
  string names [2];
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  undefined8 uStack_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  _func_int *local_e8;
  _func_int *local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  _func_int *p_Stack_d0;
  _func_int *local_c8;
  _func_int *local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  _func_int *p_Stack_b0;
  pointer local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  Variable *local_88;
  Term *local_80;
  string local_78;
  long *local_58 [2];
  long local_48 [3];
  
  pAVar2 = (Atom *)operator_new(0x20);
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"app","");
  paVar26 = &(pAVar2->atomname).field_2;
  (pAVar2->atomname)._M_dataplus._M_p = (pointer)paVar26;
  if (local_a8 == &local_98) {
    paVar26->_M_allocated_capacity = CONCAT71(uStack_97,local_98);
    *(undefined8 *)((long)&(pAVar2->atomname).field_2 + 8) = uStack_90;
  }
  else {
    (pAVar2->atomname)._M_dataplus._M_p = local_a8;
    (pAVar2->atomname).field_2._M_allocated_capacity = CONCAT71(uStack_97,local_98);
  }
  (pAVar2->atomname)._M_string_length = local_a0;
  local_a0 = 0;
  local_98 = '\0';
  local_a8 = &local_98;
  pp_Var3 = (_func_int **)operator_new(0x20);
  local_c8 = (_func_int *)&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"cons","");
  *pp_Var3 = (_func_int *)(pp_Var3 + 2);
  if (local_c8 == (_func_int *)&local_b8) {
    pp_Var3[2] = (_func_int *)CONCAT71(uStack_b7,local_b8);
    pp_Var3[3] = p_Stack_b0;
  }
  else {
    *pp_Var3 = local_c8;
    pp_Var3[2] = (_func_int *)CONCAT71(uStack_b7,local_b8);
  }
  pp_Var3[1] = local_c0;
  local_c0 = (_func_int *)0x0;
  local_b8 = (_func_int)0x0;
  local_c8 = (_func_int *)&local_b8;
  pTVar4 = (Term *)operator_new(0x20);
  pp_Var5 = (_func_int **)operator_new(0x20);
  local_e8 = (_func_int *)&local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"nil","");
  *pp_Var5 = (_func_int *)(pp_Var5 + 2);
  if (local_e8 == (_func_int *)&local_d8) {
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_d7,local_d8);
    pp_Var5[3] = p_Stack_d0;
  }
  else {
    *pp_Var5 = local_e8;
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_d7,local_d8);
  }
  pp_Var5[1] = local_e0;
  local_e0 = (_func_int *)0x0;
  local_d8 = (_func_int)0x0;
  pTVar4->_vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pTVar4[1]._vptr_Term = pp_Var5;
  *(undefined4 *)&pTVar4[2]._vptr_Term = 0;
  pTVar4[3]._vptr_Term = (_func_int **)0x0;
  local_e8 = (_func_int *)&local_d8;
  p_Var6 = (_func_int *)operator_new(0x20);
  puVar7 = (undefined8 *)operator_new(0x20);
  local_108 = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"1","");
  *puVar7 = puVar7 + 2;
  if (local_108 == &local_f8) {
    puVar7[2] = CONCAT71(uStack_f7,local_f8);
    puVar7[3] = uStack_f0;
  }
  else {
    *puVar7 = local_108;
    puVar7[2] = CONCAT71(uStack_f7,local_f8);
  }
  puVar7[1] = local_100;
  local_100 = 0;
  local_f8 = 0;
  *(undefined ***)p_Var6 = &PTR_copy_00104d80;
  *(undefined8 **)(p_Var6 + 8) = puVar7;
  *(undefined4 *)(p_Var6 + 0x10) = 0;
  *(undefined8 *)(p_Var6 + 0x18) = 0;
  local_108 = &local_f8;
  puVar7 = (undefined8 *)operator_new(0x20);
  puVar8 = (undefined8 *)operator_new(0x20);
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"2","");
  *puVar8 = puVar8 + 2;
  if (local_128 == &local_118) {
    puVar8[2] = CONCAT71(uStack_117,local_118);
    puVar8[3] = uStack_110;
  }
  else {
    *puVar8 = local_128;
    puVar8[2] = CONCAT71(uStack_117,local_118);
  }
  puVar8[1] = local_120;
  local_120 = 0;
  local_118 = 0;
  *puVar7 = &PTR_copy_00104d80;
  puVar7[1] = puVar8;
  *(undefined4 *)(puVar7 + 2) = 0;
  puVar7[3] = 0;
  local_128 = &local_118;
  puVar8 = (undefined8 *)operator_new(0x20);
  puVar9 = (undefined8 *)operator_new(0x20);
  local_148 = &local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"3","");
  *puVar9 = puVar9 + 2;
  if (local_148 == &local_138) {
    puVar9[2] = CONCAT71(uStack_137,local_138);
    puVar9[3] = uStack_130;
  }
  else {
    *puVar9 = local_148;
    puVar9[2] = CONCAT71(uStack_137,local_138);
  }
  puVar9[1] = local_140;
  local_140 = 0;
  local_138 = 0;
  *puVar8 = &PTR_copy_00104d80;
  puVar8[1] = puVar9;
  *(undefined4 *)(puVar8 + 2) = 0;
  puVar8[3] = 0;
  local_148 = &local_138;
  pTVar10 = (Term *)operator_new(0x18);
  pTVar10->_vptr_Term = (_func_int **)&PTR_copy_00104d28;
  pTVar10[1]._vptr_Term = (_func_int **)pTVar10;
  uVar1 = Variable::timestamp;
  Variable::timestamp = Variable::timestamp + 1;
  *(uint *)&pTVar10[2]._vptr_Term = Variable::timestamp;
  pCVar11 = (Compound *)operator_new(0x20);
  (pCVar11->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pCVar11->functor = pAVar2;
  pCVar11->arity = 3;
  ppTVar12 = (Term **)operator_new__(0x18);
  pCVar11->args = ppTVar12;
  *ppTVar12 = pTVar4;
  ppTVar12[1] = pTVar10;
  ppTVar12[2] = pTVar10;
  pCVar13 = (Clause *)operator_new(0x10);
  pCVar13->head = pCVar11;
  pCVar13->body = (Goal *)0x0;
  pTVar14 = (Term *)operator_new(0x18);
  pTVar14->_vptr_Term = (_func_int **)&PTR_copy_00104d28;
  pTVar14[1]._vptr_Term = (_func_int **)pTVar14;
  Variable::timestamp = uVar1 + 2;
  *(uint *)&pTVar14[2]._vptr_Term = Variable::timestamp;
  pTVar15 = (Term *)operator_new(0x18);
  pTVar15->_vptr_Term = (_func_int **)&PTR_copy_00104d28;
  pTVar15[1]._vptr_Term = (_func_int **)pTVar15;
  Variable::timestamp = uVar1 + 3;
  *(uint *)&pTVar15[2]._vptr_Term = Variable::timestamp;
  pTVar16 = (Term *)operator_new(0x18);
  pTVar16->_vptr_Term = (_func_int **)&PTR_copy_00104d28;
  pTVar16[1]._vptr_Term = (_func_int **)pTVar16;
  Variable::timestamp = uVar1 + 4;
  *(uint *)&pTVar16[2]._vptr_Term = Variable::timestamp;
  pCVar11 = (Compound *)operator_new(0x20);
  (pCVar11->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pCVar11->functor = pAVar2;
  pCVar11->arity = 3;
  ppTVar12 = (Term **)operator_new__(0x18);
  pCVar11->args = ppTVar12;
  *ppTVar12 = pTVar14;
  ppTVar12[1] = pTVar15;
  ppTVar12[2] = pTVar16;
  pCVar17 = (Compound *)operator_new(0x20);
  pTVar18 = (Term *)operator_new(0x20);
  pTVar18->_vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pTVar18[1]._vptr_Term = pp_Var3;
  *(undefined4 *)&pTVar18[2]._vptr_Term = 2;
  pp_Var5 = (_func_int **)operator_new__(0x10);
  pTVar18[3]._vptr_Term = pp_Var5;
  *pp_Var5 = (_func_int *)pTVar10;
  pp_Var5[1] = (_func_int *)pTVar14;
  pTVar14 = (Term *)operator_new(0x20);
  pTVar14->_vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pTVar14[1]._vptr_Term = pp_Var3;
  *(undefined4 *)&pTVar14[2]._vptr_Term = 2;
  pp_Var5 = (_func_int **)operator_new__(0x10);
  pTVar14[3]._vptr_Term = pp_Var5;
  *pp_Var5 = (_func_int *)pTVar10;
  pp_Var5[1] = (_func_int *)pTVar16;
  (pCVar17->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pCVar17->functor = pAVar2;
  pCVar17->arity = 3;
  ppTVar12 = (Term **)operator_new__(0x18);
  pCVar17->args = ppTVar12;
  *ppTVar12 = pTVar18;
  ppTVar12[1] = pTVar15;
  ppTVar12[2] = pTVar14;
  pCVar19 = (Clause *)operator_new(0x10);
  pGVar20 = (Goal *)operator_new(0x10);
  pGVar20->head = pCVar11;
  pGVar20->tail = (Goal *)0x0;
  pCVar19->head = pCVar17;
  pCVar19->body = pGVar20;
  pVVar21 = (Variable *)operator_new(0x18);
  (pVVar21->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00104d28;
  pVVar21->instance = (Term *)pVVar21;
  Variable::timestamp = uVar1 + 5;
  pVVar21->index = Variable::timestamp;
  pTVar10 = (Term *)operator_new(0x18);
  pTVar10->_vptr_Term = (_func_int **)&PTR_copy_00104d28;
  pTVar10[1]._vptr_Term = (_func_int **)pTVar10;
  Variable::timestamp = uVar1 + 6;
  *(uint *)&pTVar10[2]._vptr_Term = Variable::timestamp;
  pCVar11 = (Compound *)operator_new(0x20);
  pTVar14 = (Term *)operator_new(0x20);
  p_Var22 = (_func_int *)operator_new(0x20);
  puVar9 = (undefined8 *)operator_new(0x20);
  *puVar9 = &PTR_copy_00104d80;
  puVar9[1] = pp_Var3;
  *(undefined4 *)(puVar9 + 2) = 2;
  puVar23 = (undefined8 *)operator_new__(0x10);
  puVar9[3] = puVar23;
  *puVar23 = puVar8;
  puVar23[1] = pTVar4;
  *(undefined ***)p_Var22 = &PTR_copy_00104d80;
  *(_func_int ***)(p_Var22 + 8) = pp_Var3;
  *(undefined4 *)(p_Var22 + 0x10) = 2;
  puVar8 = (undefined8 *)operator_new__(0x10);
  *(undefined8 **)(p_Var22 + 0x18) = puVar8;
  *puVar8 = puVar7;
  puVar8[1] = puVar9;
  pTVar14->_vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pTVar14[1]._vptr_Term = pp_Var3;
  *(undefined4 *)&pTVar14[2]._vptr_Term = 2;
  pp_Var3 = (_func_int **)operator_new__(0x10);
  pTVar14[3]._vptr_Term = pp_Var3;
  *pp_Var3 = p_Var6;
  pp_Var3[1] = p_Var22;
  (pCVar11->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00104d80;
  pCVar11->functor = pAVar2;
  pCVar11->arity = 3;
  ppTVar12 = (Term **)operator_new__(0x18);
  pCVar11->args = ppTVar12;
  *ppTVar12 = (Term *)pVVar21;
  ppTVar12[1] = pTVar10;
  ppTVar12[2] = pTVar14;
  pGVar20 = (Goal *)operator_new(0x10);
  pGVar20->head = pCVar11;
  pGVar20->tail = (Goal *)0x0;
  prog = (Program *)operator_new(0x10);
  pPVar24 = (Program *)operator_new(0x10);
  pPVar24->head = pCVar19;
  pPVar24->tail = (Program *)0x0;
  prog->head = pCVar13;
  prog->tail = pPVar24;
  pPVar24 = (Program *)operator_new(0x10);
  pPVar25 = (Program *)operator_new(0x10);
  pPVar25->head = pCVar13;
  pPVar25->tail = (Program *)0x0;
  pPVar24->head = pCVar19;
  pPVar24->tail = pPVar25;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_88 = pVVar21;
  local_80 = pTVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"I","");
  plVar28 = local_48;
  local_58[0] = plVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"J","");
  vars_00 = (VarMapping *)operator_new(0x18);
  vars_00->vars = &local_88;
  vars_00->names = &local_78;
  vars_00->count = 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=== Normal clause order:\n",0x19);
  Goal::solve(pGVar20,prog,0,vars_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n=== Reversed clause order:\n",0x1c);
  Goal::solve(pGVar20,pPVar24,0,vars_00);
  lVar27 = -0x40;
  do {
    if (plVar28 != (long *)plVar28[-2]) {
      operator_delete((long *)plVar28[-2],*plVar28 + 1);
    }
    plVar28 = plVar28 + -4;
    lVar27 = lVar27 + 0x20;
  } while (lVar27 != 0);
  return 0;
}

Assistant:

int main()
{
    auto *atom_app = new Atom("app");
    auto *atom_cons = new Atom("cons");
    auto *nil = new Compound(new Atom("nil"));
    auto *i_1 = new Compound(new Atom("1"));
    auto *i_2 = new Compound(new Atom("2"));
    auto *i_3 = new Compound(new Atom("3"));

    //
    // Clause 1:
    //      app(nil, x, x)
    //
    auto *var_x = new Variable();
    auto *app_nil_x_x = new Compound(atom_app, nil, var_x, var_x);
    auto *clause_1 = new Clause(app_nil_x_x);

    //
    // Clause 2:
    //      app([x|l], m, [x|n]); app(l, m, n)
    //
    auto *var_l = new Variable();
    auto *var_m = new Variable();
    auto *var_n = new Variable();
    auto *app_l_m_n = new Compound(atom_app, var_l, var_m, var_n);
    auto *app_xl_m_xn = new Compound(atom_app, new Compound(atom_cons, var_x, var_l),
                                     var_m, new Compound(atom_cons, var_x, var_n));
    auto *clause_2 = new Clause(app_xl_m_xn, new Goal(app_l_m_n));

    //
    // Goal:
    //      app(i, j, [1, 2, 3])
    auto *var_i = new Variable();
    auto *var_j = new Variable();
    auto *app_i_j_123 = new Compound(atom_app, var_i, var_j,
                                     new Compound(atom_cons, i_1,
                                           new Compound(atom_cons, i_2,
                                                        new Compound(atom_cons, i_3, nil))));
    auto *goal = new Goal(app_i_j_123);

    //
    // Two test programs.
    //
    auto *prog_1 = new Program(clause_1, new Program(clause_2));
    auto *prog_2 = new Program(clause_2, new Program(clause_1));

    //
    // Two variables in the goal: I and J.
    //
    Variable *vars[] = { var_i, var_j };
    std::string names[] = { "I", "J" };
    auto *var_name_map = new VarMapping(vars, names, 2);

    //
    // Run program 1.
    //
    std::cout << "=== Normal clause order:\n";
    goal->solve(prog_1, 0, var_name_map);

    //
    // Run program 2.
    //
    std::cout << "\n=== Reversed clause order:\n";
    goal->solve(prog_2, 0, var_name_map);
    return 0;
}